

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O0

UConverter * u_getDefaultConverter_63(UErrorCode *status)

{
  UBool UVar1;
  undefined8 local_18;
  UConverter *converter;
  UErrorCode *status_local;
  
  local_18 = (UConverter *)0x0;
  if (gDefaultConverter != (UConverter *)0x0) {
    umtx_lock_63((UMutex *)0x0);
    if (gDefaultConverter != (UConverter *)0x0) {
      local_18 = gDefaultConverter;
      gDefaultConverter = (UConverter *)0x0;
    }
    umtx_unlock_63((UMutex *)0x0);
  }
  if (local_18 == (UConverter *)0x0) {
    local_18 = ucnv_open_63((char *)0x0,status);
    UVar1 = U_FAILURE(*status);
    if (UVar1 != '\0') {
      ucnv_close_63(local_18);
      local_18 = (UConverter *)0x0;
    }
  }
  return local_18;
}

Assistant:

U_CAPI UConverter* U_EXPORT2
u_getDefaultConverter(UErrorCode *status)
{
    UConverter *converter = NULL;
    
    if (gDefaultConverter != NULL) {
        umtx_lock(NULL);
        
        /* need to check to make sure it wasn't taken out from under us */
        if (gDefaultConverter != NULL) {
            converter = gDefaultConverter;
            gDefaultConverter = NULL;
        }
        umtx_unlock(NULL);
    }

    /* if the cache was empty, create a converter */
    if(converter == NULL) {
        converter = ucnv_open(NULL, status);
        if(U_FAILURE(*status)) {
            ucnv_close(converter);
            converter = NULL;
        }
    }

    return converter;
}